

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedCompanion.cc
# Opt level: O0

bool __thiscall Glucose::SharedCompanion::addSolver(SharedCompanion *this,ParallelSolver *s)

{
  pthread_mutex_t *__mutex;
  ParallelSolver **in_RDI;
  pthread_mutex_t *mu;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  vec<Glucose::ParallelSolver_*>::push
            ((vec<Glucose::ParallelSolver_*> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  __mutex = (pthread_mutex_t *)malloc(0x28);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  vec<int>::push((vec<int> *)(ulong)in_stack_ffffffffffffffe0,(int *)in_RDI);
  return true;
}

Assistant:

bool SharedCompanion::addSolver(ParallelSolver* s) {
	watchedSolvers.push(s);
	pthread_mutex_t* mu = (pthread_mutex_t*)malloc(sizeof(pthread_mutex_t));
	pthread_mutex_init(mu,NULL);
	assert(s->thn == watchedSolvers.size()-1); // all solvers must have been registered in the good order
	nextUnit.push(0);

	return true;
}